

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86.cpp
# Opt level: O2

int __thiscall ncnn::PReLU_x86::forward_inplace(PReLU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  int iVar3;
  float *pfVar4;
  long lVar5;
  _func_int **pp_Var6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  float *slope;
  ulong uVar11;
  uint _c;
  uint uVar12;
  undefined1 (*pauVar13) [16];
  ulong uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  Mat local_78;
  
  iVar8 = bottom_top_blob->dims;
  if (bottom_top_blob->elempack == 4) {
    if (iVar8 == 3) {
      uVar12 = bottom_top_blob->h * bottom_top_blob->w;
      uVar11 = 0;
      uVar9 = (ulong)uVar12;
      if ((int)uVar12 < 1) {
        uVar9 = uVar11;
      }
      uVar14 = (ulong)(uint)bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        uVar14 = uVar11;
      }
      for (; uVar11 != uVar14; uVar11 = uVar11 + 1) {
        Mat::channel(&local_78,bottom_top_blob,(int)uVar11);
        pauVar13 = (undefined1 (*) [16])local_78.data;
        Mat::~Mat(&local_78);
        if (*(int *)(&this->field_0xd0 + (long)this->_vptr_PReLU_x86[-3]) < 2) {
          fVar15 = **(float **)(&this->field_0xd8 + (long)this->_vptr_PReLU_x86[-3]);
          fVar16 = fVar15;
          fVar17 = fVar15;
          fVar18 = fVar15;
        }
        else {
          pfVar4 = *(float **)(&this->field_0xd8 + (long)this->_vptr_PReLU_x86[-3]) + uVar11 * 4;
          fVar15 = *pfVar4;
          fVar16 = pfVar4[1];
          fVar17 = pfVar4[2];
          fVar18 = pfVar4[3];
        }
        uVar10 = uVar9;
        while (iVar8 = (int)uVar10, uVar10 = (ulong)(iVar8 - 1), iVar8 != 0) {
          auVar20 = maxps(*pauVar13,ZEXT816(0));
          auVar19 = minps(*pauVar13,ZEXT816(0));
          *(float *)*pauVar13 = auVar19._0_4_ * fVar15 + auVar20._0_4_;
          *(float *)(*pauVar13 + 4) = auVar19._4_4_ * fVar16 + auVar20._4_4_;
          *(float *)(*pauVar13 + 8) = auVar19._8_4_ * fVar17 + auVar20._8_4_;
          *(float *)(*pauVar13 + 0xc) = auVar19._12_4_ * fVar18 + auVar20._12_4_;
          pauVar13 = pauVar13 + 1;
        }
      }
    }
    else if (iVar8 == 2) {
      pp_Var6 = this->_vptr_PReLU_x86;
      uVar11 = 0;
      uVar9 = (ulong)(uint)bottom_top_blob->w;
      if (bottom_top_blob->w < 1) {
        uVar9 = uVar11;
      }
      uVar14 = (ulong)(uint)bottom_top_blob->h;
      if (bottom_top_blob->h < 1) {
        uVar14 = uVar11;
      }
      for (; uVar11 != uVar14; uVar11 = uVar11 + 1) {
        if (*(int *)(&this->field_0xd0 + (long)pp_Var6[-3]) < 2) {
          fVar15 = **(float **)(&this->field_0xd8 + (long)pp_Var6[-3]);
          fVar16 = fVar15;
          fVar17 = fVar15;
          fVar18 = fVar15;
        }
        else {
          pfVar4 = *(float **)(&this->field_0xd8 + (long)pp_Var6[-3]) + uVar11 * 4;
          fVar15 = *pfVar4;
          fVar16 = pfVar4[1];
          fVar17 = pfVar4[2];
          fVar18 = pfVar4[3];
        }
        pauVar13 = (undefined1 (*) [16])
                   ((long)bottom_top_blob->w * uVar11 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar10 = uVar9;
        while (iVar8 = (int)uVar10, uVar10 = (ulong)(iVar8 - 1), iVar8 != 0) {
          auVar21 = maxps(*pauVar13,ZEXT816(0));
          auVar19 = minps(*pauVar13,ZEXT816(0));
          auVar20._0_4_ = auVar19._0_4_ * fVar15 + auVar21._0_4_;
          auVar20._4_4_ = auVar19._4_4_ * fVar16 + auVar21._4_4_;
          auVar20._8_4_ = auVar19._8_4_ * fVar17 + auVar21._8_4_;
          auVar20._12_4_ = auVar19._12_4_ * fVar18 + auVar21._12_4_;
          *pauVar13 = auVar20;
          pauVar13 = pauVar13 + 1;
        }
      }
    }
    else if (iVar8 == 1) {
      uVar12 = bottom_top_blob->w;
      pfVar4 = *(float **)(&this->field_0xd8 + (long)this->_vptr_PReLU_x86[-3]);
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_PReLU_x86[-3]) < 2) {
        fVar15 = *pfVar4;
        uVar11 = 0;
        uVar9 = (ulong)uVar12;
        if ((int)uVar12 < 1) {
          uVar9 = uVar11;
        }
        for (; uVar9 * 0x10 != uVar11; uVar11 = uVar11 + 0x10) {
          auVar19 = *(undefined1 (*) [16])((long)bottom_top_blob->data + uVar11);
          auVar20 = maxps(auVar19,ZEXT816(0));
          auVar19 = minps(auVar19,ZEXT816(0));
          pfVar4 = (float *)((long)bottom_top_blob->data + uVar11);
          *pfVar4 = auVar19._0_4_ * fVar15 + auVar20._0_4_;
          pfVar4[1] = auVar19._4_4_ * fVar15 + auVar20._4_4_;
          pfVar4[2] = auVar19._8_4_ * fVar15 + auVar20._8_4_;
          pfVar4[3] = auVar19._12_4_ * fVar15 + auVar20._12_4_;
        }
      }
      else {
        uVar11 = 0;
        uVar9 = (ulong)uVar12;
        if ((int)uVar12 < 1) {
          uVar9 = uVar11;
        }
        for (; uVar9 * 0x10 != uVar11; uVar11 = uVar11 + 0x10) {
          auVar19 = *(undefined1 (*) [16])((long)bottom_top_blob->data + uVar11);
          pfVar1 = (float *)((long)pfVar4 + uVar11);
          fVar15 = pfVar1[1];
          fVar16 = pfVar1[2];
          fVar17 = pfVar1[3];
          auVar20 = maxps(auVar19,ZEXT816(0));
          auVar19 = minps(auVar19,ZEXT816(0));
          pfVar2 = (float *)((long)bottom_top_blob->data + uVar11);
          *pfVar2 = auVar19._0_4_ * *pfVar1 + auVar20._0_4_;
          pfVar2[1] = auVar19._4_4_ * fVar15 + auVar20._4_4_;
          pfVar2[2] = auVar19._8_4_ * fVar16 + auVar20._8_4_;
          pfVar2[3] = auVar19._12_4_ * fVar17 + auVar20._12_4_;
        }
      }
    }
  }
  else {
    if (iVar8 != 3) {
      iVar8 = PReLU::forward_inplace
                        ((PReLU *)((long)&this->_vptr_PReLU_x86 + (long)this->_vptr_PReLU_x86[-3]),
                         bottom_top_blob,opt);
      return iVar8;
    }
    iVar8 = bottom_top_blob->h;
    uVar12 = bottom_top_blob->c;
    iVar3 = bottom_top_blob->w;
    lVar5 = *(long *)(&this->field_0xd8 + (long)this->_vptr_PReLU_x86[-3]);
    _c = 0;
    if ((int)uVar12 < 1) {
      uVar12 = 0;
    }
    for (; _c != uVar12; _c = _c + 1) {
      Mat::channel(&local_78,bottom_top_blob,_c);
      pauVar13 = (undefined1 (*) [16])local_78.data;
      Mat::~Mat(&local_78);
      uVar9 = 0;
      if (1 < *(int *)(&this->field_0xd0 + (long)this->_vptr_PReLU_x86[-3])) {
        uVar9 = (ulong)_c;
      }
      fVar15 = *(float *)(lVar5 + uVar9 * 4);
      for (iVar7 = iVar8 * iVar3; 0 < iVar7; iVar7 = iVar7 + -1) {
        if (*(float *)*pauVar13 < 0.0) {
          *(float *)*pauVar13 = *(float *)*pauVar13 * fVar15;
        }
        pauVar13 = (undefined1 (*) [16])(*pauVar13 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            if (num_slope > 1)
            {
                const float* slope = slope_data;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _slope = _mm256_loadu_ps(slope + i * 8);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                }
            }
            else
            {
                __m256 _slope = _mm256_set1_ps(slope_data[0]);

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);
                __m256 _slope = num_slope > 1 ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_set1_ps(slope_data[0]);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                __m256 _slope = num_slope > 1 ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_set1_ps(slope_data[0]);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            if (num_slope > 1)
            {
                const float* slope = slope_data;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _slope = _mm_loadu_ps(slope + i * 4);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                }
            }
            else
            {
                __m128 _slope = _mm_set1_ps(slope_data[0]);

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);
                __m128 _slope = num_slope > 1 ? _mm_loadu_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope_data[0]);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                __m128 _slope = num_slope > 1 ? _mm_loadu_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope_data[0]);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (dims != 3)
        return PReLU::forward_inplace(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    const float* slope_data_ptr = slope_data;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);
        float slope = num_slope > 1 ? slope_data_ptr[q] : slope_data_ptr[0];

#if __AVX__
        int nn = size >> 3;
        int remain = size - (nn << 3);
#else
        int remain = size;
#endif // __AVX__

#if __AVX__
        for (; nn > 0; nn--)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, prelu_avx(_p, _mm256_set1_ps(slope)));
            ptr += 8;
        }
#endif // __AVX__
        for (; remain > 0; remain--)
        {
            if (*ptr < 0)
                *ptr *= slope;

            ptr++;
        }
    }

    return 0;
}